

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

LBBox3fa * __thiscall
embree::sse2::PointsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,PointsISA *this,size_t primID,BBox1f *time_range)

{
  float *pfVar1;
  float *pfVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  uint uVar8;
  size_t *psVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  undefined1 auVar36 [16];
  float fVar39;
  
  fVar15 = (this->super_Points).super_Geometry.fnumTimeSegments;
  fVar34 = (this->super_Points).super_Geometry.time_range.lower;
  fVar16 = (this->super_Points).super_Geometry.time_range.upper - fVar34;
  fVar20 = (time_range->lower - fVar34) / fVar16;
  fVar16 = (time_range->upper - fVar34) / fVar16;
  fVar12 = fVar15 * fVar20;
  fVar29 = fVar15 * fVar16;
  fVar13 = floorf(fVar12);
  fVar14 = ceilf(fVar29);
  fVar37 = 0.0;
  fVar34 = fVar13;
  if (fVar13 <= 0.0) {
    fVar34 = fVar37;
  }
  fVar38 = fVar14;
  if (fVar15 <= fVar14) {
    fVar38 = fVar15;
  }
  iVar7 = -1;
  if (-1 < (int)fVar13) {
    iVar7 = (int)fVar13;
  }
  uVar4 = (int)fVar15 + 1U;
  if ((int)fVar14 < (int)((int)fVar15 + 1U)) {
    uVar4 = (int)fVar14;
  }
  lVar10 = (long)(int)fVar34;
  pBVar3 = (this->super_Points).vertices.items;
  pfVar1 = (float *)(pBVar3[lVar10].super_RawBufferView.ptr_ofs +
                    pBVar3[lVar10].super_RawBufferView.stride * primID);
  fVar14 = pfVar1[3];
  fVar13 = (this->super_Points).maxRadiusScale;
  fVar21 = *pfVar1 - fVar14 * fVar13;
  fVar22 = pfVar1[1] - fVar14 * fVar13;
  fVar23 = pfVar1[2] - fVar14 * fVar13;
  fVar24 = fVar14 - fVar14 * fVar13;
  fVar17 = fVar14 * fVar13 + *pfVar1;
  fVar18 = fVar14 * fVar13 + pfVar1[1];
  fVar19 = fVar14 * fVar13 + pfVar1[2];
  fVar14 = fVar14 * fVar13 + fVar14;
  lVar11 = (long)(int)fVar38;
  pfVar1 = (float *)(pBVar3[lVar11].super_RawBufferView.ptr_ofs +
                    pBVar3[lVar11].super_RawBufferView.stride * primID);
  fVar28 = pfVar1[3];
  fVar30 = *pfVar1 - fVar28 * fVar13;
  fVar31 = pfVar1[1] - fVar28 * fVar13;
  fVar32 = pfVar1[2] - fVar28 * fVar13;
  fVar33 = fVar28 - fVar28 * fVar13;
  fVar25 = fVar28 * fVar13 + *pfVar1;
  fVar26 = fVar28 * fVar13 + pfVar1[1];
  fVar27 = fVar28 * fVar13 + pfVar1[2];
  fVar28 = fVar28 * fVar13 + fVar28;
  if (uVar4 - iVar7 == 1) {
    fVar15 = fVar12 - fVar34;
    if (fVar12 - fVar34 <= 0.0) {
      fVar15 = fVar37;
    }
    fVar34 = 1.0 - fVar15;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar21 * fVar34 + fVar15 * fVar30;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar22 * fVar34 + fVar15 * fVar31;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar23 * fVar34 + fVar15 * fVar32;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar24 * fVar34 + fVar15 * fVar33;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar34 * fVar17 + fVar15 * fVar25;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar34 * fVar18 + fVar15 * fVar26;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar34 * fVar19 + fVar15 * fVar27;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar34 * fVar14 + fVar15 * fVar28;
    fVar15 = fVar38 - fVar29;
    if (fVar38 - fVar29 <= 0.0) {
      fVar15 = fVar37;
    }
    fVar34 = 1.0 - fVar15;
    fVar30 = fVar30 * fVar34 + fVar21 * fVar15;
    fVar31 = fVar31 * fVar34 + fVar22 * fVar15;
    fVar32 = fVar32 * fVar34 + fVar23 * fVar15;
    fVar33 = fVar33 * fVar34 + fVar24 * fVar15;
    fVar29 = fVar34 * fVar25 + fVar15 * fVar17;
    fVar37 = fVar34 * fVar26 + fVar15 * fVar18;
    fVar38 = fVar34 * fVar27 + fVar15 * fVar19;
    fVar34 = fVar34 * fVar28 + fVar15 * fVar14;
  }
  else {
    pfVar1 = (float *)(pBVar3[lVar10 + 1].super_RawBufferView.ptr_ofs +
                      pBVar3[lVar10 + 1].super_RawBufferView.stride * primID);
    fVar5 = pfVar1[3];
    pfVar2 = (float *)(pBVar3[lVar11 + -1].super_RawBufferView.ptr_ofs +
                      pBVar3[lVar11 + -1].super_RawBufferView.stride * primID);
    fVar6 = pfVar2[3];
    fVar39 = fVar12 - fVar34;
    if (fVar12 - fVar34 <= 0.0) {
      fVar39 = fVar37;
    }
    fVar34 = 1.0 - fVar39;
    fVar21 = fVar21 * fVar34 + (*pfVar1 - fVar5 * fVar13) * fVar39;
    fVar22 = fVar22 * fVar34 + (pfVar1[1] - fVar5 * fVar13) * fVar39;
    fVar23 = fVar23 * fVar34 + (pfVar1[2] - fVar5 * fVar13) * fVar39;
    fVar24 = fVar24 * fVar34 + (fVar5 - fVar5 * fVar13) * fVar39;
    fVar12 = fVar17 * fVar34 + fVar39 * (fVar5 * fVar13 + *pfVar1);
    fVar17 = fVar18 * fVar34 + fVar39 * (fVar5 * fVar13 + pfVar1[1]);
    fVar18 = fVar19 * fVar34 + fVar39 * (fVar5 * fVar13 + pfVar1[2]);
    fVar14 = fVar14 * fVar34 + fVar39 * (fVar5 * fVar13 + fVar5);
    fVar34 = fVar38 - fVar29;
    if (fVar38 - fVar29 <= 0.0) {
      fVar34 = fVar37;
    }
    fVar19 = 1.0 - fVar34;
    fVar30 = fVar30 * fVar19 + (*pfVar2 - fVar6 * fVar13) * fVar34;
    fVar31 = fVar31 * fVar19 + (pfVar2[1] - fVar6 * fVar13) * fVar34;
    fVar32 = fVar32 * fVar19 + (pfVar2[2] - fVar6 * fVar13) * fVar34;
    fVar33 = fVar33 * fVar19 + (fVar6 - fVar6 * fVar13) * fVar34;
    fVar29 = fVar25 * fVar19 + fVar34 * (fVar6 * fVar13 + *pfVar2);
    fVar37 = fVar26 * fVar19 + fVar34 * (fVar6 * fVar13 + pfVar2[1]);
    fVar38 = fVar27 * fVar19 + fVar34 * (fVar6 * fVar13 + pfVar2[2]);
    fVar34 = fVar28 * fVar19 + fVar34 * (fVar6 * fVar13 + fVar6);
    uVar8 = iVar7 + 1;
    if ((int)uVar8 < (int)uVar4) {
      psVar9 = &pBVar3[uVar8].super_RawBufferView.stride;
      do {
        fVar19 = ((float)(int)uVar8 / fVar15 - fVar20) / (fVar16 - fVar20);
        fVar25 = 1.0 - fVar19;
        pfVar1 = (float *)(((RawBufferView *)(psVar9 + -2))->ptr_ofs + *psVar9 * primID);
        fVar28 = pfVar1[3];
        auVar35._0_4_ = (*pfVar1 - fVar28 * fVar13) - (fVar21 * fVar25 + fVar30 * fVar19);
        auVar35._4_4_ = (pfVar1[1] - fVar28 * fVar13) - (fVar22 * fVar25 + fVar31 * fVar19);
        auVar35._8_4_ = (pfVar1[2] - fVar28 * fVar13) - (fVar23 * fVar25 + fVar32 * fVar19);
        auVar35._12_4_ = (fVar28 - fVar28 * fVar13) - (fVar24 * fVar25 + fVar33 * fVar19);
        auVar36._0_4_ = (fVar28 * fVar13 + *pfVar1) - (fVar25 * fVar12 + fVar19 * fVar29);
        auVar36._4_4_ = (fVar28 * fVar13 + pfVar1[1]) - (fVar25 * fVar17 + fVar19 * fVar37);
        auVar36._8_4_ = (fVar28 * fVar13 + pfVar1[2]) - (fVar25 * fVar18 + fVar19 * fVar38);
        auVar36._12_4_ = (fVar28 * fVar13 + fVar28) - (fVar25 * fVar14 + fVar19 * fVar34);
        auVar35 = minps(auVar35,ZEXT816(0));
        auVar36 = maxps(auVar36,ZEXT816(0));
        fVar21 = fVar21 + auVar35._0_4_;
        fVar22 = fVar22 + auVar35._4_4_;
        fVar23 = fVar23 + auVar35._8_4_;
        fVar24 = fVar24 + auVar35._12_4_;
        fVar30 = auVar35._0_4_ + fVar30;
        fVar31 = auVar35._4_4_ + fVar31;
        fVar32 = auVar35._8_4_ + fVar32;
        fVar33 = auVar35._12_4_ + fVar33;
        fVar12 = fVar12 + auVar36._0_4_;
        fVar17 = fVar17 + auVar36._4_4_;
        fVar18 = fVar18 + auVar36._8_4_;
        fVar14 = fVar14 + auVar36._12_4_;
        fVar29 = auVar36._0_4_ + fVar29;
        fVar37 = auVar36._4_4_ + fVar37;
        fVar38 = auVar36._8_4_ + fVar38;
        fVar34 = auVar36._12_4_ + fVar34;
        uVar8 = uVar8 + 1;
        psVar9 = psVar9 + 7;
      } while (uVar4 != uVar8);
    }
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar21;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar22;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar23;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar24;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar12;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar17;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar18;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar14;
  }
  (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = fVar30;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fVar31;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fVar32;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fVar33;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar29;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar37;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar38;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar34;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t primID, const BBox1f& time_range) const
      {
        return linearBounds(primID, time_range);
      }